

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void auxsetstr(lua_State *L,TValue *t,char *k)

{
  TValue *key;
  int iVar1;
  undefined4 uVar2;
  TString *key_00;
  TValue *slot;
  StkId pTVar3;
  long lVar4;
  
  key_00 = luaS_new(L,k);
  if (t->tt_ == 0x45) {
    slot = luaH_getstr((Table *)(t->value_).gc,key_00);
    if (slot->tt_ != 0) {
      pTVar3 = L->top;
      if ((((pTVar3[-1].tt_ & 0x40) != 0) && ((((Table *)(t->value_).gc)->marked & 4) != 0)) &&
         (((pTVar3[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t->value_).gc);
        pTVar3 = L->top;
      }
      iVar1 = pTVar3[-1].tt_;
      uVar2 = *(undefined4 *)&pTVar3[-1].field_0xc;
      slot->value_ = pTVar3[-1].value_;
      slot->tt_ = iVar1;
      *(undefined4 *)&slot->field_0xc = uVar2;
      lVar4 = -0x10;
      goto LAB_0010dd73;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pTVar3 = L->top;
  (pTVar3->value_).gc = (GCObject *)key_00;
  pTVar3->tt_ = key_00->tt | 0x40;
  key = L->top;
  L->top = key + 1;
  luaV_finishset(L,t,key,key + -1,slot);
  lVar4 = -0x20;
LAB_0010dd73:
  L->top = (StkId)((long)&L->top->value_ + lVar4);
  return;
}

Assistant:

static void auxsetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  api_checknelems(L, 1);
  if (luaV_fastset(L, t, str, slot, luaH_getstr, L->top - 1))
    L->top--;  /* pop value */
  else {
    setsvalue2s(L, L->top, str);  /* push 'str' (to make it a TValue) */
    api_incr_top(L);
    luaV_finishset(L, t, L->top - 1, L->top - 2, slot);
    L->top -= 2;  /* pop value and key */
  }
  lua_unlock(L);  /* lock done by caller */
}